

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

HighsInt __thiscall
HighsCliqueTable::runCliqueSubsumption
          (HighsCliqueTable *this,HighsDomain *globaldom,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique)

{
  pointer *ppCVar1;
  double *pdVar2;
  double dVar3;
  int cliqueid_00;
  pointer puVar4;
  CliqueVar *pCVar5;
  iterator __position;
  pointer piVar6;
  uint uVar7;
  pointer pCVar8;
  pointer puVar9;
  ValueType *pVVar10;
  pointer pCVar11;
  CliqueVar *pCVar12;
  pointer pCVar13;
  pointer pdVar14;
  pointer pCVar15;
  long lVar16;
  iterator __begin5;
  int *piVar17;
  ulong __new_size;
  pointer pdVar18;
  ulong uVar19;
  pointer pCVar20;
  HighsInt cliqueid;
  CliqueVar v;
  anon_class_8_1_8991fb9c local_60;
  int local_54;
  uint local_50;
  CliqueVar local_4c;
  HighsDomain *local_48;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_40;
  int *local_38;
  
  pCVar15 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar20 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar19 = (long)pCVar20 - (long)pCVar15;
  if (uVar19 == 8) {
    return 0;
  }
  __new_size = ((long)(this->cliques).
                      super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->cliques).
                      super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  if ((ulong)((long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cliquehits,__new_size);
    pCVar15 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar20 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar19 = (long)pCVar20 - (long)pCVar15;
  }
  pCVar8 = pCVar15;
  if (0 < (long)uVar19 >> 4) {
    puVar9 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pCVar11 = (pointer)((long)&pCVar15->field_0x0 + (uVar19 & 0xfffffffffffffff0));
    lVar16 = ((long)uVar19 >> 4) + 1;
    pCVar8 = pCVar15 + 2;
    do {
      if (puVar9[(uint)pCVar8[-2] & 0x7fffffff] != '\0') {
        pCVar8 = pCVar8 + -2;
        goto LAB_0025b5b7;
      }
      if (puVar9[(uint)pCVar8[-1] & 0x7fffffff] != '\0') {
        pCVar8 = pCVar8 + -1;
        goto LAB_0025b5b7;
      }
      if (puVar9[(uint)*pCVar8 & 0x7fffffff] != '\0') goto LAB_0025b5b7;
      if (puVar9[(uint)pCVar8[1] & 0x7fffffff] != '\0') {
        pCVar8 = pCVar8 + 1;
        goto LAB_0025b5b7;
      }
      lVar16 = lVar16 + -1;
      pCVar8 = pCVar8 + 4;
    } while (1 < lVar16);
    uVar19 = (long)pCVar20 - (long)pCVar11;
    pCVar8 = pCVar11;
  }
  lVar16 = (long)uVar19 >> 2;
  if (lVar16 == 3) {
    puVar9 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar9[(uint)*pCVar8 & 0x7fffffff] == '\0') {
      pCVar8 = pCVar8 + 1;
      goto LAB_0025b588;
    }
LAB_0025b5b7:
    if (pCVar8 != pCVar20) {
      pCVar12 = pCVar8 + 1;
      if (pCVar12 != pCVar20) {
        do {
          if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[(uint)*pCVar12 & 0x7fffffff] == '\0') {
            *pCVar8 = *pCVar12;
            pCVar8 = pCVar8 + 1;
          }
          pCVar12 = pCVar12 + 1;
        } while (pCVar12 != pCVar20);
        pCVar15 = (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pCVar20 = (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pCVar8 != pCVar20) {
        (clique->
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        )._M_impl.super__Vector_impl_data._M_finish = pCVar8;
        pCVar20 = pCVar8;
      }
    }
  }
  else {
    if (lVar16 == 2) {
      puVar9 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_0025b588:
      if (puVar9[(uint)*pCVar8 & 0x7fffffff] == '\0') {
        pCVar8 = pCVar8 + 1;
        goto LAB_0025b59a;
      }
      goto LAB_0025b5b7;
    }
    if (lVar16 == 1) {
      puVar9 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_0025b59a:
      if (puVar9[(uint)*pCVar8 & 0x7fffffff] == '\0') {
        pCVar8 = pCVar20;
      }
      goto LAB_0025b5b7;
    }
  }
  local_48 = globaldom;
  if (pCVar15 != pCVar20) {
    do {
      uVar7 = (int)*pCVar15 << 1 | (uint)((int)*pCVar15 < 0);
      local_60.this = this;
      HighsHashTree<int,_int>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:108:42)_&,_0>
                ((NodePtr)(this->invertedHashList).
                          super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].root.ptrAndType,
                 &local_60);
      local_60.this = this;
      HighsHashTree<int,_void>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:115:49)_&,_0>
                ((NodePtr)(this->invertedHashListSizeTwo).
                          super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].root.ptrAndType,
                 &local_60);
      pCVar15 = pCVar15 + 1;
    } while (pCVar15 != pCVar20);
  }
  piVar17 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar17 == local_38) {
    local_54 = 0;
  }
  else {
    local_40 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack;
    local_54 = 0;
    local_50 = 0;
    do {
      cliqueid_00 = *piVar17;
      local_60.this._0_4_ = cliqueid_00;
      puVar4 = (this->cliquehits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = puVar4[cliqueid_00];
      puVar4[cliqueid_00] = 0;
      pCVar12 = (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pCVar5 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (uVar7 == (uint)((ulong)((long)pCVar5 - (long)pCVar12) >> 2)) {
        local_50 = (uint)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
      }
      else {
        pCVar13 = (this->cliques).
                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                  ._M_impl.super__Vector_impl_data._M_start + cliqueid_00;
        if (pCVar13->end - (pCVar13->start + pCVar13->numZeroFixed) == uVar7) {
          if (pCVar13->equality == true) {
            for (; pCVar12 != pCVar5; pCVar12 = pCVar12 + 1) {
              local_4c = *pCVar12;
              pCVar13 = (this->cliques).
                        super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = (int)local_4c << 1 | (uint)((int)local_4c < 0);
              uVar19 = ((ulong)local_60.this & 0xffffffff) * -0x7f3769c41c1b3d0d +
                       0x9eefcacfe7301de3 >> 0x20 ^
                       ((ulong)local_60.this & 0xffffffff) * -0x75e7c76a1153eaca +
                       0x1da24fc66dd63e32;
              if (pCVar13[(int)local_60.this].end - pCVar13[(int)local_60.this].start == 2) {
                pVVar10 = HighsHashTree<int,_void>::find_recurse
                                    ((NodePtr)(this->invertedHashListSizeTwo).
                                              super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].
                                              root.ptrAndType,uVar19,0,(int *)&local_60);
              }
              else {
                pVVar10 = HighsHashTree<int,_int>::find_recurse
                                    ((NodePtr)(this->invertedHashList).
                                              super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].
                                              root.ptrAndType,uVar19,0,(int *)&local_60);
              }
              if (pVVar10 == (ValueType *)0x0) {
                __position._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            (local_40,__position,&local_4c);
                }
                else {
                  *__position._M_current = local_4c;
                  ppCVar1 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
            }
          }
          else {
            local_54 = local_54 + 1;
            pCVar13->origin = 0x7fffffff;
            removeClique(this,cliqueid_00);
          }
        }
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 != local_38);
    piVar6 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
    }
    if (((local_50 & 1) != 0) &&
       (pCVar15 = (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start,
       (clique->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_finish != pCVar15)) {
      (clique->
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>)
      ._M_impl.super__Vector_impl_data._M_finish = pCVar15;
    }
  }
  if ((this->infeasvertexstack).
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->infeasvertexstack).
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    return local_54;
  }
  pCVar15 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar20 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar19 = (long)pCVar20 - (long)pCVar15;
  if (0 < (long)uVar19 >> 4) {
    pdVar14 = (local_48->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (local_48->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar8 = (pointer)((long)&pCVar15->field_0x0 + (uVar19 & 0xfffffffffffffff0));
    lVar16 = ((long)uVar19 >> 4) + 1;
    pCVar15 = pCVar15 + 2;
    do {
      if ((pdVar14[(uint)pCVar15[-2] & 0x7fffffff] == pdVar18[(uint)pCVar15[-2] & 0x7fffffff]) &&
         (!NAN(pdVar14[(uint)pCVar15[-2] & 0x7fffffff]) &&
          !NAN(pdVar18[(uint)pCVar15[-2] & 0x7fffffff]))) {
        pCVar15 = pCVar15 + -2;
        goto LAB_0025b9c4;
      }
      if ((pdVar14[(uint)pCVar15[-1] & 0x7fffffff] == pdVar18[(uint)pCVar15[-1] & 0x7fffffff]) &&
         (!NAN(pdVar14[(uint)pCVar15[-1] & 0x7fffffff]) &&
          !NAN(pdVar18[(uint)pCVar15[-1] & 0x7fffffff]))) {
        pCVar15 = pCVar15 + -1;
        goto LAB_0025b9c4;
      }
      if ((pdVar14[(uint)*pCVar15 & 0x7fffffff] == pdVar18[(uint)*pCVar15 & 0x7fffffff]) &&
         (!NAN(pdVar14[(uint)*pCVar15 & 0x7fffffff]) && !NAN(pdVar18[(uint)*pCVar15 & 0x7fffffff])))
      goto LAB_0025b9c4;
      if ((pdVar14[(uint)pCVar15[1] & 0x7fffffff] == pdVar18[(uint)pCVar15[1] & 0x7fffffff]) &&
         (!NAN(pdVar14[(uint)pCVar15[1] & 0x7fffffff]) &&
          !NAN(pdVar18[(uint)pCVar15[1] & 0x7fffffff]))) {
        pCVar15 = pCVar15 + 1;
        goto LAB_0025b9c4;
      }
      lVar16 = lVar16 + -1;
      pCVar15 = pCVar15 + 4;
    } while (1 < lVar16);
    uVar19 = (long)pCVar20 - (long)pCVar8;
    pCVar15 = pCVar8;
  }
  lVar16 = (long)uVar19 >> 2;
  if (lVar16 == 3) {
    pdVar14 = (local_48->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (local_48->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pdVar14[(uint)*pCVar15 & 0x7fffffff] == pdVar18[(uint)*pCVar15 & 0x7fffffff]) &&
       (!NAN(pdVar14[(uint)*pCVar15 & 0x7fffffff]) && !NAN(pdVar18[(uint)*pCVar15 & 0x7fffffff])))
    goto LAB_0025b9c4;
    pCVar15 = pCVar15 + 1;
LAB_0025b986:
    if ((pdVar14[(uint)*pCVar15 & 0x7fffffff] == pdVar18[(uint)*pCVar15 & 0x7fffffff]) &&
       (!NAN(pdVar14[(uint)*pCVar15 & 0x7fffffff]) && !NAN(pdVar18[(uint)*pCVar15 & 0x7fffffff])))
    goto LAB_0025b9c4;
    pCVar15 = pCVar15 + 1;
  }
  else {
    if (lVar16 == 2) {
      pdVar14 = (local_48->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar18 = (local_48->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_0025b986;
    }
    if (lVar16 != 1) {
      return local_54;
    }
    pdVar14 = (local_48->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (local_48->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pdVar14[(uint)*pCVar15 & 0x7fffffff] != pdVar18[(uint)*pCVar15 & 0x7fffffff]) {
    return local_54;
  }
  if (NAN(pdVar14[(uint)*pCVar15 & 0x7fffffff]) || NAN(pdVar18[(uint)*pCVar15 & 0x7fffffff])) {
    return local_54;
  }
LAB_0025b9c4:
  if (pCVar15 != pCVar20) {
    pCVar8 = pCVar15 + 1;
    if (pCVar8 != pCVar20) {
      do {
        uVar7 = (uint)*pCVar8 & 0x7fffffff;
        dVar3 = (local_48->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        pdVar2 = (local_48->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7;
        if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) {
          *pCVar15 = *pCVar8;
          pCVar15 = pCVar15 + 1;
        }
        pCVar8 = pCVar8 + 1;
      } while (pCVar8 != pCVar20);
      pCVar20 = (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pCVar15 != pCVar20) {
      (clique->
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>)
      ._M_impl.super__Vector_impl_data._M_finish = pCVar15;
    }
  }
  return local_54;
}

Assistant:

HighsInt HighsCliqueTable::runCliqueSubsumption(
    const HighsDomain& globaldom, std::vector<CliqueVar>& clique) {
  if (clique.size() == 2) return 0;
  HighsInt nremoved = 0;
  bool redundant = false;
  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  clique.erase(
      std::remove_if(clique.begin(), clique.end(),
                     [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
      clique.end());

  for (CliqueVar v : clique) {
    invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });

    // for (const auto& entry : invertedHashListSizeTwo[v.index()])
    invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });
  }

  for (HighsInt cliqueid : cliquehitinds) {
    HighsInt hits = cliquehits[cliqueid];
    cliquehits[cliqueid] = 0;

    HighsInt len = cliques[cliqueid].end - cliques[cliqueid].start -
                   cliques[cliqueid].numZeroFixed;
    if (hits == (HighsInt)clique.size())
      redundant = true;
    else if (len == hits) {
      if (cliques[cliqueid].equality) {
        for (CliqueVar v : clique) {
          bool sizeTwo = cliques[cliqueid].end - cliques[cliqueid].start == 2;
          bool vHasClq =
              sizeTwo ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
          if (!vHasClq) infeasvertexstack.push_back(v);
        }
      } else {
        ++nremoved;
        cliques[cliqueid].origin = kHighsIInf;
        removeClique(cliqueid);
      }
    }
  }

  cliquehitinds.clear();

  if (redundant) clique.clear();

  if (!infeasvertexstack.empty()) {
    clique.erase(
        std::remove_if(clique.begin(), clique.end(),
                       [&](CliqueVar v) { return globaldom.isFixed(v.col); }),
        clique.end());
  }

  return nremoved;
}